

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRNetInterface.h
# Opt level: O0

int32_t MinVR::VRNetInterface::unpackInt(uchar *bytePtr)

{
  bool bVar1;
  long in_RDI;
  int index;
  int i;
  uchar *p;
  int toReturn;
  int local_20;
  int local_1c;
  int32_t local_c;
  long local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    local_20 = local_1c;
    bVar1 = isLittleEndian();
    if (!bVar1) {
      local_20 = 3 - local_1c;
    }
    *(undefined1 *)((long)&local_c + (long)local_1c) = *(undefined1 *)(local_8 + local_20);
  }
  return local_c;
}

Assistant:

static int32_t unpackInt(unsigned char *bytePtr) {
		int toReturn = 0;
		unsigned char *p = (unsigned char *) &toReturn;
		for (int i=0;i<VRNET_SIZEOFINT;i++) {
			int index = i;
			if (!isLittleEndian()) {
				index = VRNET_SIZEOFINT - i - 1;
			}
			p[i] = bytePtr[index];
		}
		return toReturn;
	}